

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void uv__async_stop(uv_loop_t *loop,uv__async *wa)

{
  uv_loop_t *in_RSI;
  uv__io_t *in_stack_ffffffffffffffe8;
  
  if ((int)in_RSI->flags != -1) {
    uv__io_stop(in_RSI,in_stack_ffffffffffffffe8,0);
    uv__close((int)((ulong)in_RSI >> 0x20));
    *(undefined4 *)&in_RSI->flags = 0xffffffff;
    if (in_RSI->backend_fd != -1) {
      uv__close((int)((ulong)in_RSI >> 0x20));
      in_RSI->backend_fd = -1;
    }
  }
  return;
}

Assistant:

void uv__async_stop(uv_loop_t* loop, struct uv__async* wa) {
  if (wa->io_watcher.fd == -1)
    return;

  uv__io_stop(loop, &wa->io_watcher, UV__POLLIN);
  uv__close(wa->io_watcher.fd);
  wa->io_watcher.fd = -1;

  if (wa->wfd != -1) {
    uv__close(wa->wfd);
    wa->wfd = -1;
  }
}